

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O1

char * dirname(char *__path)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  String *in_RSI;
  
  uVar3 = String::lastIndexOf(in_RSI,"/",-1);
  if ((int)uVar3 < 1) {
    cVar1 = *(in_RSI->_string)._M_dataplus._M_p;
    *(char **)__path = __path + 0x10;
    if (cVar1 == '/') {
      pcVar2 = "*/";
      pcVar4 = "";
    }
    else {
      pcVar4 = "";
      pcVar2 = "\t";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__path,pcVar2 + 1,pcVar4);
  }
  else {
    String::mid((String *)__path,in_RSI,0,(ulong)uVar3);
  }
  return __path;
}

Assistant:

String dirname (String const& path)
{
	int lastpos = path.lastIndexOf (DIRSLASH);

	if (lastpos > 0)
		return path.mid (0, lastpos);

#ifndef _WIN32
	if (path[0] == '/')
		return "/";
#endif // _WIN32

	return "";
}